

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int coresume(lua_State *L)

{
  uint uVar1;
  lua_State *L_00;
  int iVar2;
  
  iVar2 = 1;
  L_00 = lua_tothread(L,1);
  if (L_00 == (lua_State *)0x0) {
    luaL_argerror(L,1,"coroutine expected");
  }
  uVar1 = lua_resume(L_00,L,0);
  if (uVar1 < 2) {
    lua_pushboolean(L,1);
  }
  else {
    lua_pushboolean(L,0);
    lua_rotate(L,-2,1);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int coresume (lua_State *L) {
  int status;
  lua_State *co = lua_tothread(L, 1);
  luaL_argcheck(L, co, 1, "coroutine expected");
  status = lua_resume(co, L, 0);
  if (status != LUA_OK && status != LUA_YIELD) {
    lua_pushboolean(L, 0);
    lua_insert(L, -2);
    return 2;  /* return false + error message */
  }
  else {
    lua_pushboolean(L, 1);
    return 1;
  }
}